

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template.cc
# Opt level: O1

void ctemplate::StripTemplateWhiteSpace(char **str,size_t *len)

{
  char *pcVar1;
  int iVar2;
  size_t sVar3;
  
  sVar3 = *len;
  if (sVar3 != 0) {
    pcVar1 = *str;
    do {
      sVar3 = sVar3 - 1;
      if ((pcVar1[sVar3] < '\0') || (iVar2 = isspace((int)pcVar1[sVar3]), iVar2 == 0)) break;
      *len = sVar3;
    } while (sVar3 != 0);
  }
  sVar3 = *len;
  if (sVar3 != 0) {
    pcVar1 = *str;
    do {
      sVar3 = sVar3 - 1;
      if (*pcVar1 < '\0') {
        return;
      }
      iVar2 = isspace((int)*pcVar1);
      if (iVar2 == 0) {
        return;
      }
      *len = sVar3;
      *str = pcVar1 + 1;
      pcVar1 = pcVar1 + 1;
    } while (sVar3 != 0);
  }
  return;
}

Assistant:

static void StripTemplateWhiteSpace(const char** str, size_t* len) {
  // Strip off trailing whitespace.
  while ((*len) > 0 && ascii_isspace((*str)[(*len)-1])) {
    (*len)--;
  }

  // Strip off leading whitespace.
  while ((*len) > 0 && ascii_isspace((*str)[0])) {
    (*len)--;
    (*str)++;
  }
}